

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

void __thiscall
icu_63::LocaleDisplayNamesImpl::LocaleDisplayNamesImpl
          (LocaleDisplayNamesImpl *this,Locale *locale,UDialectHandling dialectHandling)

{
  (this->super_LocaleDisplayNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleDisplayNamesImpl_003f3790;
  Locale::Locale(&this->locale);
  this->dialectHandling = dialectHandling;
  ICUDataTable::ICUDataTable(&this->langData,"icudt63l-lang",locale);
  ICUDataTable::ICUDataTable(&this->regionData,"icudt63l-region",locale);
  UnicodeString::UnicodeString(&(this->separatorFormat).compiledPattern,L'\0');
  UnicodeString::UnicodeString(&(this->format).compiledPattern,L'\0');
  UnicodeString::UnicodeString(&(this->keyTypeFormat).compiledPattern,L'\0');
  this->capitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  (this->formatOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003febe0;
  (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003febe0;
  (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003febe0;
  (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003febe0;
  (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  this->nameLength = UDISPCTX_LENGTH_FULL;
  initialize(this);
  return;
}

Assistant:

LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(const Locale& locale,
                                               UDialectHandling dialectHandling)
    : dialectHandling(dialectHandling)
    , langData(U_ICUDATA_LANG, locale)
    , regionData(U_ICUDATA_REGION, locale)
    , capitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
    , capitalizationBrkIter(NULL)
    , nameLength(UDISPCTX_LENGTH_FULL)
{
    initialize();
}